

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_DimRadial *
ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial
          (ON_DimRadial *V6_dim_radial,ON_3dmAnnotationContext *annotation_context,
          ON_OBSOLETE_V5_DimRadial *destination)

{
  double dVar1;
  double dVar2;
  AnnotationType AVar3;
  bool bVar4;
  int iVar5;
  ON_DimStyle *parent_dimstyle;
  ON_DimStyle *V6_dim_style;
  ON_Plane *plane;
  ON_2dPoint *pOVar6;
  wchar_t *pwVar7;
  ON_OBSOLETE_V5_DimExtra *this;
  ON_UUID detail_id;
  ON_2dPoint OVar8;
  ON_OBSOLETE_V5_Annotation *local_f0;
  ON_OBSOLETE_V5_DimExtra *extra;
  ON_wString plaintext;
  double text_height;
  double dim_scale;
  double dStack_b0;
  bool bLeaderHasLanding;
  double ll;
  undefined1 local_68 [8];
  ON_2dPointArray dimpoints;
  V5_TextDisplayMode mode;
  ON_OBSOLETE_V5_DimRadial *V5_dim_radial;
  ON_DimStyle *parent_dim_style;
  ON_OBSOLETE_V5_DimRadial *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_DimRadial *V6_dim_radial_local;
  
  destination_local = (ON_OBSOLETE_V5_DimRadial *)annotation_context;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    destination_local = (ON_OBSOLETE_V5_DimRadial *)&ON_3dmAnnotationContext::Default;
  }
  parent_dimstyle =
       ON_3dmAnnotationContext::ParentDimStyle((ON_3dmAnnotationContext *)destination_local);
  local_f0 = &destination->super_ON_OBSOLETE_V5_Annotation;
  if (destination == (ON_OBSOLETE_V5_DimRadial *)0x0) {
    local_f0 = (ON_OBSOLETE_V5_Annotation *)operator_new(0xe0);
    ON_OBSOLETE_V5_DimRadial((ON_OBSOLETE_V5_DimRadial *)local_f0);
  }
  AVar3 = ON_Annotation::Type((ON_Annotation *)V6_dim_radial);
  if (AVar3 == Radius) {
    ON_OBSOLETE_V5_Annotation::SetType(local_f0,dtDimRadius);
  }
  else {
    ON_OBSOLETE_V5_Annotation::SetType(local_f0,dtDimDiameter);
  }
  V6_dim_style = ON_Annotation::DimensionStyle((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_ =
       ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(V6_dim_style);
  ON_OBSOLETE_V5_Annotation::SetTextDisplayMode
            (local_f0,dimpoints.super_ON_SimpleArray<ON_2dPoint>.m_count._3_1_);
  plane = ON_Annotation::Plane((ON_Annotation *)V6_dim_radial);
  ON_OBSOLETE_V5_Annotation::SetPlane(local_f0,plane);
  ON_2dPointArray::ON_2dPointArray((ON_2dPointArray *)local_68,4);
  OVar8 = ON_DimRadial::CenterPoint(V6_dim_radial);
  pOVar6 = ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_68);
  pOVar6->x = OVar8.x;
  pOVar6->y = OVar8.y;
  OVar8 = ON_DimRadial::RadiusPoint(V6_dim_radial);
  pOVar6 = ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_68);
  pOVar6->x = OVar8.x;
  pOVar6->y = OVar8.y;
  OVar8 = ON_DimRadial::DimlinePoint(V6_dim_radial);
  pOVar6 = ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_68);
  pOVar6->x = OVar8.x;
  pOVar6->y = OVar8.y;
  OVar8 = ON_DimRadial::KneePoint(V6_dim_radial);
  pOVar6 = ON_SimpleArray<ON_2dPoint>::AppendNew((ON_SimpleArray<ON_2dPoint> *)local_68);
  pOVar6->x = OVar8.x;
  pOVar6->y = OVar8.y;
  dStack_b0 = 0.0;
  bVar4 = ON_Annotation::LeaderHasLanding((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  dVar2 = ON_Annotation::DimScale((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  plaintext.m_s =
       (wchar_t *)ON_Annotation::TextHeight((ON_Annotation *)V6_dim_radial,parent_dimstyle);
  if (bVar4) {
    dStack_b0 = ON_Annotation::LeaderLandingLength((ON_Annotation *)V6_dim_radial,parent_dimstyle);
    dStack_b0 = dStack_b0 * dVar2;
  }
  else {
    pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,3);
    dVar1 = pOVar6->x;
    pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,2);
    if (ABS(dVar1 - pOVar6->x) < 2.3283064365386963e-10) {
      dStack_b0 = (double)plaintext.m_s * dVar2;
    }
  }
  pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,3);
  dVar2 = pOVar6->x;
  pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,1);
  if (dVar2 < pOVar6->x) {
    pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,2);
    pOVar6->x = pOVar6->x - dStack_b0;
  }
  else {
    pOVar6 = ON_SimpleArray<ON_2dPoint>::operator[]((ON_SimpleArray<ON_2dPoint> *)local_68,2);
    pOVar6->x = dStack_b0 + pOVar6->x;
  }
  ON_OBSOLETE_V5_Annotation::SetPoints(local_f0,(ON_2dPointArray *)local_68);
  iVar5 = (*(V6_dim_radial->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.
            super_ON_Object._vptr_ON_Object[0x2b])();
  ON_OBSOLETE_V5_Annotation::SetUserPositionedText(local_f0,(byte)~(byte)iVar5 & 1);
  pwVar7 = ON_Dimension::PlainUserText(&V6_dim_radial->super_ON_Dimension);
  ON_wString::ON_wString((ON_wString *)&extra,pwVar7);
  pwVar7 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&extra);
  ON_OBSOLETE_V5_Annotation::SetTextValue(local_f0,pwVar7);
  local_f0->m_textheight = (double)plaintext.m_s;
  iVar5 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex
                    ((ON_3dmAnnotationContext *)destination_local);
  ON_OBSOLETE_V5_Annotation::SetV5_3dmArchiveDimStyleIndex(local_f0,iVar5);
  this = ON_OBSOLETE_V5_DimExtra::DimensionExtension((ON_OBSOLETE_V5_DimRadial *)local_f0,true);
  if (this != (ON_OBSOLETE_V5_DimExtra *)0x0) {
    detail_id = ON_Dimension::DetailMeasured(&V6_dim_radial->super_ON_Dimension);
    ON_OBSOLETE_V5_DimExtra::SetDetailMeasured(this,detail_id);
    dVar2 = ON_Dimension::DistanceScale(&V6_dim_radial->super_ON_Dimension);
    ON_OBSOLETE_V5_DimExtra::SetDistanceScale(this,dVar2);
  }
  ON_wString::~ON_wString((ON_wString *)&extra);
  ON_2dPointArray::~ON_2dPointArray((ON_2dPointArray *)local_68);
  return (ON_OBSOLETE_V5_DimRadial *)local_f0;
}

Assistant:

ON_OBSOLETE_V5_DimRadial* ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial(
  const class ON_DimRadial& V6_dim_radial,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_DimRadial* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();

  ON_OBSOLETE_V5_DimRadial* V5_dim_radial
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_DimRadial();

  if (ON::AnnotationType::Radius == V6_dim_radial.Type())
    V5_dim_radial->SetType(ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius);
  else
    V5_dim_radial->SetType(ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter);

  //ON::TextVerticalAlignment valign = dimstyle->TextVerticalAlignment();
  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode mode = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(V6_dim_radial.DimensionStyle(parent_dim_style));

  V5_dim_radial->SetTextDisplayMode(mode);
  V5_dim_radial->SetPlane(V6_dim_radial.Plane());
  ON_2dPointArray dimpoints(4);
  dimpoints.AppendNew() = V6_dim_radial.CenterPoint();
  dimpoints.AppendNew() = V6_dim_radial.RadiusPoint();
  dimpoints.AppendNew() = V6_dim_radial.DimlinePoint();
  dimpoints.AppendNew() = V6_dim_radial.KneePoint();
  
  double ll = 0.0;
  const bool bLeaderHasLanding = V6_dim_radial.LeaderHasLanding(&parent_dim_style);
  const double dim_scale = V6_dim_radial.DimScale(&parent_dim_style);
  const double text_height = V6_dim_radial.TextHeight(&parent_dim_style);

  if( bLeaderHasLanding )
    ll = V6_dim_radial.LeaderLandingLength(&parent_dim_style) * dim_scale;
  else if (fabs(dimpoints[3].x - dimpoints[2].x) < ON_ZERO_TOLERANCE)
    ll = text_height * dim_scale;

  if (dimpoints[3].x >= dimpoints[1].x)
    dimpoints[2].x += ll;
  else
    dimpoints[2].x -= ll;

  V5_dim_radial->SetPoints(dimpoints);
  V5_dim_radial->SetUserPositionedText(!V6_dim_radial.UseDefaultTextPoint());
  
  const ON_wString plaintext = V6_dim_radial.PlainUserText();
  V5_dim_radial->SetTextValue(plaintext);
  
  V5_dim_radial->m_textheight = text_height;

  V5_dim_radial->SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex() );

  ON_OBSOLETE_V5_DimExtra* extra = ON_OBSOLETE_V5_DimExtra::DimensionExtension(V5_dim_radial, true);
  if (nullptr != extra)
  {
    extra->SetDetailMeasured(V6_dim_radial.DetailMeasured());
    extra->SetDistanceScale(V6_dim_radial.DistanceScale());
  }

  return V5_dim_radial;
}